

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmod.c
# Opt level: O1

int it_mod_read_sample_data(IT_SAMPLE *sample,DUMBFILE *f,uint32 fft)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int32 iVar4;
  char *ptr;
  long lVar5;
  char cVar6;
  int iVar7;
  
  iVar7 = 0;
  if ((sample->flags & 0x10) != 0) {
    iVar3 = sample->loop_end;
    iVar2 = sample->length - iVar3;
    if (iVar2 != 0 && iVar3 <= sample->length) {
      sample->length = iVar3;
      iVar7 = iVar2;
    }
  }
  iVar3 = sample->length;
  if ((long)iVar3 != 0) {
    ptr = (char *)malloc((long)iVar3);
    sample->data = ptr;
    if (ptr == (char *)0x0) {
      return -1;
    }
    if (iVar3 < 5) {
      iVar3 = dumbfile_getnc(ptr,iVar3,f);
    }
    else {
      iVar3 = dumbfile_getnc(ptr,5,f);
      if (iVar3 == 5) {
        piVar1 = (int *)sample->data;
        if ((char)piVar1[1] == 'M' && *piVar1 == 0x43504441) {
          iVar4 = _dumb_it_read_sample_data_adpcm4(sample,f);
          return iVar4 >> 0x1f;
        }
        iVar4 = dumbfile_getnc((char *)((long)piVar1 + 5),sample->length + -5,f);
        iVar3 = iVar4 + 5;
      }
    }
    if (iVar3 < sample->length) {
      if (iVar3 < 1) {
        sample->flags = '\0';
        return 0;
      }
      sample->length = iVar3;
      if (iVar3 < sample->loop_end) {
        sample->loop_end = iVar3;
      }
      if (iVar3 < sample->loop_start) {
        sample->flags = sample->flags & 0xef;
      }
    }
    else {
      iVar3 = dumbfile_error(f);
      if (iVar7 != 0) {
        dumbfile_skip(f,(long)iVar7);
      }
      if (iVar3 != 0) {
        return -1;
      }
    }
    if ((fft == 0x4d000000) || (fft == 0x38000000)) {
      if (0 < sample->length) {
        lVar5 = 0;
        cVar6 = '\0';
        do {
          cVar6 = cVar6 + *(char *)((long)sample->data + lVar5);
          *(char *)((long)sample->data + lVar5) = cVar6;
          lVar5 = lVar5 + 1;
        } while (lVar5 < sample->length);
        return 0;
      }
      return 0;
    }
  }
  return 0;
}

Assistant:

static int it_mod_read_sample_data(IT_SAMPLE *sample, DUMBFILE *f, uint32 fft)
{
	int32 i;
	int32 truncated_size;

	/* let's get rid of the sample data coming after the end of the loop */
	if ((sample->flags & IT_SAMPLE_LOOP) && sample->loop_end < sample->length) {
		truncated_size = sample->length - sample->loop_end;
		sample->length = sample->loop_end;
	} else {
		truncated_size = 0;
	}

	if (sample->length) {
		sample->data = malloc(sample->length);

		if (!sample->data)
			return -1;

		/* Sample data are stored in "8-bit two's compliment format" (sic). */
		/*
		for (i = 0; i < sample->length; i++)
			((signed char *)sample->left)[i] = dumbfile_getc(f);
		*/
		/* F U Olivier Lapicque */
		if (sample->length >= 5)
		{
			i = dumbfile_getnc(sample->data, 5, f);
			if (i == 5)
			{
				if (!memcmp(sample->data, "ADPCM", 5))
				{
					if (_dumb_it_read_sample_data_adpcm4(sample, f) < 0)
						return -1;

					return 0;
				}
				else
				{
					i += dumbfile_getnc(((char *)sample->data) + 5, sample->length - 5, f);
				}
			}
		}
		else
		{
			i = dumbfile_getnc(sample->data, sample->length, f);
		}
		if (i < sample->length)
		{
			if (i <= 0)
			{
				sample->flags = 0;
				return 0;
			}
			sample->length = i;
			if (sample->loop_end > i) sample->loop_end = i;
			// holy crap!
			if (sample->loop_start > i) sample->flags &= ~IT_SAMPLE_LOOP;
		}
		else
		{
			/* skip truncated data */
			int feh = dumbfile_error(f);

			if (truncated_size) dumbfile_skip(f, truncated_size);
			// Should we be truncating it?

			if (feh)
				return -1;
		}

		if (fft == DUMB_ID('M',0,0,0) || fft == DUMB_ID('8',0,0,0)) {
			int delta = 0;
			for (i = 0; i < sample->length; i++) {
				delta += ((signed char *)sample->data)[i];
				((signed char *)sample->data)[i] = delta;
			}
		}
	}

	return 0;
}